

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.cc
# Opt level: O0

Status __thiscall leveldb::Env::NewAppendableFile(Env *this,string *fname,WritableFile **result)

{
  Slice *in_RDI;
  string *in_stack_ffffffffffffffa8;
  Slice *msg;
  
  msg = in_RDI;
  Slice::Slice(in_RDI,(char *)in_stack_ffffffffffffffa8);
  Slice::Slice(in_RDI,in_stack_ffffffffffffffa8);
  Status::NotSupported(msg,in_RDI);
  return (Status)(char *)msg;
}

Assistant:

Status Env::NewAppendableFile(const std::string& fname, WritableFile** result) {
  return Status::NotSupported("NewAppendableFile", fname);
}